

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O1

int64_t yactfr::internal::anon_unknown_0::readFlSIntLe57At3(uint8_t *buf)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = ((ulong)*(ushort *)(buf + 1) |
          CONCAT44((uint)buf[5] | (uint)buf[6] << 8 | (uint)buf[7] << 0x10,
                   (uint)buf[3] << 0x10 | (uint)buf[4] << 0x18) & 0xfffffffffffff) << 5;
  uVar2 = *buf >> 3 | uVar3;
  uVar1 = uVar2 | 0xfe00000000000000;
  if (uVar3 >> 0x38 == 0) {
    uVar1 = uVar2;
  }
  return uVar1;
}

Assistant:

std::int64_t readFlSIntLe57At3(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[7];
    res <<= 8;
    res |= buf[6];
    res <<= 8;
    res |= buf[5];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 5;
    res |= (buf[0] >> 3);
    res &= UINT64_C(0x1ffffffffffffff);

    if (res >> 56) {
        res |= UINT64_C(0xfe00000000000000);
    }

    return static_cast<std::int64_t>(res);
}